

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movegen.cpp
# Opt level: O0

void puppup::movegen::__impl::gen
               (Rack *r,idx step,idx cursor,idx orig_cursor,nodeid node,Gaddag *gaddag,State *state,
               idx non_multipliable_score,idx multipliable_score,idx word_mult,
               vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *outputs,
               bool best_only,array<long,_16384UL> *orthogonal_memo,idx blanks,idx placed)

{
  chr child;
  idx non_multipliable_score_00;
  idx iVar1;
  vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *this;
  Gaddag *gaddag_00;
  nodeid nVar2;
  idx iVar3;
  idx r_00;
  bool bVar4;
  long cursor_00;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  nodeid nVar9;
  chr i;
  anon_class_128_16_5f1c26f7 evaluate;
  chr j;
  idx word_mult_new;
  idx local_b8;
  idx local_b0;
  idx local_a8;
  idx local_a0;
  value_type local_98;
  long local_70;
  idx score;
  Gaddag *pGStack_60;
  bool best_only_local;
  Gaddag *gaddag_local;
  nodeid node_local;
  idx orig_cursor_local;
  idx cursor_local;
  idx step_local;
  Rack *r_local;
  
  score._7_1_ = best_only;
  pGStack_60 = gaddag;
  gaddag_local = (Gaddag *)node;
  node_local = orig_cursor;
  orig_cursor_local = cursor;
  cursor_local = step;
  step_local = (idx)r;
  if ((((cursor != orig_cursor) && (step < 0)) &&
      (bVar4 = trie::Gaddag::has(gaddag,node,0x1f), bVar4)) &&
     ((bVar4 = edge(orig_cursor_local), bVar4 ||
      (pvVar6 = std::array<long,_256UL>::operator[](&state->board,orig_cursor_local),
      *pvVar6 == 0x1b)))) {
    iVar3 = step_local;
    nVar2 = node_local;
    lVar8 = -cursor_local;
    cursor_00 = node_local - cursor_local;
    nVar9 = trie::Gaddag::get(pGStack_60,(nodeid)gaddag_local,0x1f);
    gen((Rack *)iVar3,lVar8,cursor_00,nVar2,nVar9,pGStack_60,state,non_multipliable_score,
        multipliable_score,word_mult,outputs,(bool)(score._7_1_ & 1),orthogonal_memo,blanks,placed);
  }
  if (((0 < placed) && (0 < cursor_local)) &&
     ((bVar4 = trie::Gaddag::exists(pGStack_60,(nodeid)gaddag_local), bVar4 &&
      ((bVar4 = edge(orig_cursor_local), bVar4 ||
       (pvVar6 = std::array<long,_256UL>::operator[](&state->board,orig_cursor_local),
       *pvVar6 == 0x1b)))))) {
    local_70 = non_multipliable_score + multipliable_score * word_mult;
    if (6 < placed) {
      local_70 = local_70 + 0x23;
    }
    if (((score._7_1_ & 1) == 0) ||
       (bVar4 = std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::empty
                          (outputs), lVar8 = local_70, bVar4)) {
      this = outputs;
      local_98.score = local_70;
      local_98.word = trie::Gaddag::nodeToWord(pGStack_60,(nodeid)gaddag_local);
      local_98.cursor = orig_cursor_local;
      local_98.step = cursor_local;
      local_98.blanks = blanks;
      std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::push_back
                (this,&local_98);
    }
    else {
      pvVar5 = std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::back
                         (outputs);
      if (pvVar5->score < lVar8) {
        word_mult_new = local_70;
        local_b8 = trie::Gaddag::nodeToWord(pGStack_60,(nodeid)gaddag_local);
        local_b0 = orig_cursor_local;
        local_a8 = cursor_local;
        local_a0 = blanks;
        pvVar5 = std::vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_>::back
                           (outputs);
        memcpy(pvVar5,&word_mult_new,0x28);
      }
    }
  }
  bVar4 = edge(orig_cursor_local);
  if (!bVar4) {
    pvVar6 = std::array<long,_256UL>::operator[](&state->board,orig_cursor_local);
    if (*pvVar6 == 0x1b) {
      j = word_mult * *(long *)(board::word_multiplier + orig_cursor_local * 8);
      for (evaluate.placed = (idx *)0x0; (long)evaluate.placed < 0x1b;
          evaluate.placed = (idx *)((long)evaluate.placed + 1)) {
        bVar4 = trie::Gaddag::has(pGStack_60,(nodeid)gaddag_local,(chr)evaluate.placed);
        if (bVar4) {
          i = step_local;
          evaluate.r = (Rack *)state;
          evaluate.state = (State *)&orig_cursor_local;
          evaluate.cursor = (idx *)&evaluate.placed;
          evaluate.j = &blanks;
          evaluate.blanks = orthogonal_memo->_M_elems;
          evaluate.orthogonal_memo = (array<long,_16384UL> *)&cursor_local;
          evaluate.step = (idx *)pGStack_60;
          evaluate.gaddag = (Gaddag *)&node_local;
          evaluate.orig_cursor = (idx *)&gaddag_local;
          evaluate.node = &non_multipliable_score;
          evaluate.non_multipliable_score = &multipliable_score;
          evaluate.multipliable_score = &j;
          evaluate.word_mult_new = (idx *)outputs;
          evaluate.outputs =
               (vector<puppup::movegen::Move,_std::allocator<puppup::movegen::Move>_> *)
               ((long)&score + 7);
          evaluate.best_only = (bool *)&placed;
          pvVar7 = std::array<long,_32UL>::operator[]
                             ((array<long,_32UL> *)step_local,(size_type)evaluate.placed);
          if (*pvVar7 != 0) {
            gen::anon_class_128_16_5f1c26f7::operator()
                      ((anon_class_128_16_5f1c26f7 *)&i,(chr)evaluate.placed);
          }
          pvVar7 = std::array<long,_32UL>::operator[]((array<long,_32UL> *)step_local,0x1a);
          if (*pvVar7 != 0) {
            gen::anon_class_128_16_5f1c26f7::operator()((anon_class_128_16_5f1c26f7 *)&i,0x1a);
          }
        }
      }
    }
    else {
      pvVar6 = std::array<long,_256UL>::operator[](&state->board,orig_cursor_local);
      child = *pvVar6;
      bVar4 = trie::Gaddag::has(pGStack_60,(nodeid)gaddag_local,child);
      r_00 = step_local;
      iVar3 = cursor_local;
      nVar2 = node_local;
      if (bVar4) {
        lVar8 = orig_cursor_local + cursor_local;
        nVar9 = trie::Gaddag::get(pGStack_60,(nodeid)gaddag_local,child);
        gaddag_00 = pGStack_60;
        iVar1 = multipliable_score;
        non_multipliable_score_00 = non_multipliable_score;
        pvVar6 = std::array<long,_256UL>::operator[](&state->letter_score,orig_cursor_local);
        gen((Rack *)r_00,iVar3,lVar8,nVar2,nVar9,gaddag_00,state,non_multipliable_score_00,
            iVar1 + *pvVar6,word_mult,outputs,(bool)(score._7_1_ & 1),orthogonal_memo,blanks,placed)
        ;
      }
    }
  }
  return;
}

Assistant:

void gen(Rack& r, idx step, idx cursor, idx orig_cursor, trie::nodeid node,
         const trie::Gaddag& gaddag, board::State& state,
         idx non_multipliable_score, idx multipliable_score, idx word_mult,
         std::vector<Move>& outputs, const bool best_only,
         std::array<idx, 256 * 32 * 2>& orthogonal_memo, idx blanks,
         idx placed) {
    // we have gone far enough in the reverse direction, time to turn around
    if (cursor != orig_cursor && step < 0 &&
        (gaddag.has(node, trie::rev_marker) &&
         (edge(cursor) || state.board[cursor] == emptiness))) {
        gen(r, -step, orig_cursor - step, orig_cursor,
            gaddag.get(node, trie::rev_marker), gaddag, state,
            non_multipliable_score, multipliable_score, word_mult, outputs,
            best_only, orthogonal_memo, blanks, placed);
    }
    // we have found a valid word
    if (placed > 0 && step > 0 && gaddag.exists(node) &&
        (edge(cursor) || state.board[cursor] == emptiness)) {
        idx score = non_multipliable_score + multipliable_score * word_mult;
        if (placed >= 7) score += bingo_bonus;
        if (!best_only || outputs.empty()) {
            outputs.push_back(
                {score, gaddag.nodeToWord(node), cursor, step, blanks});
        } else {
            if (score > outputs.back().score) {
                outputs.back() = {score, gaddag.nodeToWord(node), cursor, step,
                                  blanks};
            }
        }
    }
    // we have gone out of bounds
    if (edge(cursor)) {
        return;
    }
    // traverse over undiscovered land
    if (state.board[cursor] == emptiness) {
        idx word_mult_new = word_mult * board::word_multiplier[cursor];
        /*
        for (trie::nodeid child = gaddag.firstChild(node);
             child != trie::invalid; child = gaddag.nextSibling(child)) {
            chr j = gaddag.val(child);
            if (j >= emptiness) break;
            */
        for (chr j = 0; j < emptiness; ++j) {
            if (!gaddag.has(node, j)) continue;
            auto evaluate = [&](const chr i) {
                --r[i];
                state.board[cursor] = j;
                state.letter_score[cursor] = scores[i];
                idx newblanks = blanks;
                idx blankness = 0;
                if (i == blank) {
                    blankness = 1;
                    newblanks <<= idx(16LL);
                    newblanks |= cursor + 1;
                }
                idx orth_score =
                    orthogonal_memo[2 * (cursor * 32 + j) + blankness];
                if (orth_score == -2) {
                    orth_score = orthogonal(turn(step), cursor, gaddag, state);
                    orthogonal_memo[2 * (cursor * 32 + j) + blankness] =
                        orth_score;
                }
                if (orth_score >= 0) {
                    gen(r, step, cursor + step, orig_cursor,
                        gaddag.get(node, j), gaddag, state,
                        non_multipliable_score + orth_score,
                        multipliable_score +
                            scores[i] * board::letter_multiplier[cursor],
                        word_mult_new, outputs, best_only, orthogonal_memo,
                        newblanks, placed + 1);
                }
                state.board[cursor] = emptiness;
                state.letter_score[cursor] = 0;
                ++r[i];
            };
            if (r[j]) evaluate(j);
            if (r[blank]) evaluate(blank);
        }
    } else {
        // traverse over existing tiles
        const chr i = state.board[cursor];
        if (gaddag.has(node, i)) {
            gen(r, step, cursor + step, orig_cursor, gaddag.get(node, i),
                gaddag, state, non_multipliable_score,
                multipliable_score + state.letter_score[cursor], word_mult,
                outputs, best_only, orthogonal_memo, blanks, placed);
        }
    }
}